

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::find_layer_index_by_name(Net *this,char *name)

{
  bool bVar1;
  char *pcVar2;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Layer *layer;
  size_t i;
  char *__rhs;
  char *local_20;
  
  local_20 = (char *)0x0;
  while( true ) {
    __rhs = local_20;
    pcVar2 = (char *)std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                               ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                (in_RDI[2]._M_string_length + 0x20));
    if (pcVar2 <= __rhs) {
      fprintf(_stderr,"find_layer_index_by_name %s failed",in_RSI);
      fprintf(_stderr,"\n");
      return -1;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
               (in_RDI[2]._M_string_length + 0x20),(size_type)local_20);
    bVar1 = std::operator==(in_RDI,__rhs);
    if (bVar1) break;
    local_20 = local_20 + 1;
  }
  return (int)local_20;
}

Assistant:

int Net::find_layer_index_by_name(const char* name) const
{
    for (size_t i = 0; i < d->layers.size(); i++)
    {
        const Layer* layer = d->layers[i];
        if (layer->name == name)
        {
            return static_cast<int>(i);
        }
    }

    NCNN_LOGE("find_layer_index_by_name %s failed", name);
    return -1;
}